

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2boolean_operation.cc
# Opt level: O0

bool __thiscall
S2BooleanOperation::Impl::CrossingProcessor::AddPointEdge
          (CrossingProcessor *this,S2Point *p,int dimension)

{
  value_type_conflict3 local_25;
  int local_24;
  S2Point *pSStack_20;
  int dimension_local;
  S2Point *p_local;
  CrossingProcessor *this_local;
  
  if (this->builder_ == (S2Builder *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    local_24 = dimension;
    pSStack_20 = p;
    p_local = (S2Point *)this;
    if ((this->prev_inside_ & 1U) == 0) {
      SetClippingState(this,-1,true);
    }
    local_25 = (value_type_conflict3)local_24;
    std::vector<signed_char,_std::allocator<signed_char>_>::push_back
              (this->input_dimensions_,&local_25);
    S2Builder::AddEdge(this->builder_,pSStack_20,pSStack_20);
    this->prev_inside_ = true;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool AddPointEdge(const S2Point& p, int dimension) {
    if (builder_ == nullptr) return false;  // Boolean output.
    if (!prev_inside_) SetClippingState(kSetInside, true);
    input_dimensions_->push_back(dimension);
    builder_->AddEdge(p, p);
    prev_inside_ = true;
    return true;
  }